

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::setColor(int x,int y,char color)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"setColor ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,color);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::API::setColor(int x, int y, char color) {
    std::cout << "setColor " << x << " " << y << " " << color << std::endl;
}